

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonpatch::detail::
operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::~operation_unwinder
          (operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this)

{
  bool bVar1;
  reference peVar2;
  undefined8 *in_RDI;
  reverse_iterator it;
  error_code ec;
  basic_json_pointer<char> *in_stack_000000a8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_stack_000000b0;
  error_code *in_stack_ffffffffffffff58;
  reference in_stack_ffffffffffffff60;
  vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
  *in_stack_ffffffffffffff68;
  reference in_stack_ffffffffffffff70;
  error_code local_18;
  
  std::error_code::error_code((error_code *)in_stack_ffffffffffffff60);
  if (*(int *)(in_RDI + 1) != 2) {
    std::
    vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
    ::rbegin(in_stack_ffffffffffffff68);
    while( true ) {
      std::
      vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
      ::rend(in_stack_ffffffffffffff68);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                               *)in_stack_ffffffffffffff60,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                               *)in_stack_ffffffffffffff58);
      if (!bVar1) break;
      peVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                            *)in_stack_ffffffffffffff60);
      if (peVar2->op == add) {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                     *)in_stack_ffffffffffffff60);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                     *)in_stack_ffffffffffffff60);
        jsonpointer::
        add<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff70,(basic_json_pointer<char> *)in_stack_ffffffffffffff68,
                   (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        bVar1 = std::error_code::operator_cast_to_bool(&local_18);
        if (bVar1) break;
      }
      else {
        peVar2 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                              *)in_stack_ffffffffffffff60);
        if (peVar2->op == remove) {
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
          ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                       *)in_stack_ffffffffffffff60);
          jsonpointer::
          remove<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                    (in_stack_000000b0,in_stack_000000a8,(error_code *)this);
          bVar1 = std::error_code::operator_cast_to_bool(&local_18);
          if (bVar1) break;
        }
        else {
          peVar2 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                                *)in_stack_ffffffffffffff60);
          if (peVar2->op == replace) {
            in_stack_ffffffffffffff68 =
                 (vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
                  *)*in_RDI;
            in_stack_ffffffffffffff70 =
                 std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                              *)in_stack_ffffffffffffff60);
            in_stack_ffffffffffffff58 = (error_code *)&in_stack_ffffffffffffff70->path;
            in_stack_ffffffffffffff60 =
                 std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                              *)in_stack_ffffffffffffff60);
            jsonpointer::
            replace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_ffffffffffffff70,
                       (basic_json_pointer<char> *)in_stack_ffffffffffffff68,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            bVar1 = std::error_code::operator_cast_to_bool(&local_18);
            if (bVar1) break;
          }
        }
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry_*,_std::vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>_>_>
                    *)in_stack_ffffffffffffff60);
    }
  }
  std::
  vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
  ::~vector((vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
             *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

~operation_unwinder() noexcept
        {
            std::error_code ec;
            if (state != state_type::commit)
            {
                for (auto it = stack.rbegin(); it != stack.rend(); ++it)
                {
                    if ((*it).op == op_type::add)
                    {
                        jsonpointer::add(target,(*it).path,(*it).value,ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            //std::cout << "add: " << (*it).path << '\n';
                            break;
                        }
                    }
                    else if ((*it).op == op_type::remove)
                    {
                        jsonpointer::remove(target,(*it).path,ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            //std::cout << "remove: " << (*it).path << '\n';
                            break;
                        }
                    }
                    else if ((*it).op == op_type::replace)
                    {
                        jsonpointer::replace(target,(*it).path,(*it).value,ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            //std::cout << "replace: " << (*it).path << '\n';
                            break;
                        }
                    }
                }
            }
        }